

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayops.c
# Opt level: O1

LispPTR N_OP_misc4(LispPTR data,LispPTR base,LispPTR typenumber,LispPTR inx,int alpha)

{
  undefined4 uVar1;
  ulong uVar2;
  uint uVar3;
  DLword *pDVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  byte *pbVar9;
  
  if (alpha != 7) {
    MachineState.tosvalue = inx;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  uVar2 = (ulong)base;
  uVar8 = (ulong)data;
  if ((inx & 0xfff0000) == 0xe0000) {
    uVar7 = inx & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(inx >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    if ((inx & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
    }
    uVar7 = *(uint *)(Lisp_world + inx);
    if ((int)uVar7 < 0) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  if ((typenumber & 0xfff0000) == 0xe0000) {
    uVar5 = typenumber & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(typenumber >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    if ((typenumber & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
    }
    uVar5 = *(uint *)(Lisp_world + typenumber);
    if ((int)uVar5 < 0) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  pDVar4 = MDStypetbl;
  uVar3 = data >> 8;
  if ((int)uVar5 < 0x26) {
    if ((int)uVar5 < 4) {
      if (uVar5 != 0) {
        if (uVar5 != 3) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        if ((data & 0xfff0000) == 0xe0000) {
          uVar5 = data & 0xffff;
        }
        else {
          if ((*(ushort *)((ulong)(uVar3 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
            MachineState.tosvalue = inx;
            MachineState.errorexit = 1;
            return 0xffffffff;
          }
          if ((data & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar8);
          }
          uVar5 = *(uint *)(Lisp_world + uVar8);
          if ((int)uVar5 < 0) {
            MachineState.tosvalue = inx;
            MachineState.errorexit = 1;
            return 0xffffffff;
          }
        }
        if (0xff < uVar5) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        *(char *)((long)Lisp_world + (ulong)uVar7 + uVar2 * 2 ^ 3) = (char)uVar5;
        return data;
      }
      if ((data & 0xfff0000) == 0xe0000) {
        uVar5 = data & 0xffff;
      }
      else {
        if ((*(ushort *)((ulong)(uVar3 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        if ((data & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar8);
        }
        uVar5 = *(uint *)(Lisp_world + uVar8);
        if ((int)uVar5 < 0) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
      }
      if (1 < uVar5) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pbVar9 = (byte *)((long)Lisp_world + (ulong)(uVar7 >> 3) + uVar2 * 2 ^ 3);
      bVar6 = *pbVar9;
      if (uVar5 == 0) {
        bVar6 = bVar6 & (char)(-1 << (~(byte)uVar7 & 7)) - 1U;
      }
      else {
        bVar6 = bVar6 | (byte)(1 << (~(byte)uVar7 & 7));
      }
      *pbVar9 = bVar6;
      return data;
    }
    if (uVar5 == 4) {
      if ((data & 0xfff0000) == 0xe0000) {
        uVar5 = data & 0xffff;
      }
      else {
        if ((*(ushort *)((ulong)(uVar3 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        if ((data & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar8);
        }
        uVar5 = *(uint *)(Lisp_world + uVar8);
        if ((int)uVar5 < 0) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
      }
      if (0xffff < uVar5) {
        MachineState.errorexit = 1;
        MachineState.tosvalue = inx;
        return 0xffffffff;
      }
      *(short *)((ulong)(Lisp_world + uVar2 + uVar7) ^ 2) = (short)uVar5;
      return data;
    }
    if (uVar5 != 0x14) {
      if (uVar5 != 0x16) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      if ((data & 0xfff0000) == 0xf0000) {
        uVar5 = data | 0xffff0000;
      }
      else if ((data & 0xfff0000) == 0xe0000) {
        uVar5 = data & 0xffff;
      }
      else {
        if ((*(ushort *)((ulong)(uVar3 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        if ((data & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar8);
        }
        uVar5 = *(uint *)(Lisp_world + uVar8);
      }
      if ((base & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
      }
      *(uint *)(Lisp_world + uVar2 + (ulong)uVar7 * 2) = uVar5;
      return data;
    }
    if ((data & 0xfff8000) != 0xe0000 && (data & 0xfff8000) != 0xf8000) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  else {
    if ((int)uVar5 < 0x43) {
      if (uVar5 == 0x26) {
        if ((base & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
        }
        uVar8 = (ulong)uVar7;
        if ((-1 < *(short *)((ulong)(pDVar4 + (*(uint *)(Lisp_world + uVar2 + uVar8 * 2) >> 9)) ^ 2)
            ) && (*GcDisabled_word != 0x4c)) {
          if (*Reclaim_cnt_word == 0) {
            if ((base & 1) != 0) {
              printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
            }
            rec_htfind(*(LispPTR *)(Lisp_world + uVar2 + uVar8 * 2),1);
          }
          else {
            if ((base & 1) != 0) {
              printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
            }
            htfind(*(LispPTR *)(Lisp_world + uVar2 + uVar8 * 2),1);
          }
        }
        if ((-1 < *(short *)((ulong)(uVar3 & 0xfffffe) + (long)MDStypetbl ^ 2)) &&
           (*GcDisabled_word != 0x4c)) {
          if (*Reclaim_cnt_word == 0) {
            rec_htfind(data,0);
          }
          else {
            htfind(data,0);
          }
        }
        if ((base & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
        }
        *(LispPTR *)(Lisp_world + uVar2 + uVar8 * 2) = data;
        return data;
      }
      if (uVar5 != 0x36) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      if ((*(ushort *)((ulong)(uVar3 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 3) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      if ((data & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar8);
      }
      uVar1 = *(undefined4 *)(Lisp_world + uVar8);
      if ((base & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
      }
      *(undefined4 *)(Lisp_world + uVar2 + (ulong)uVar7 * 2) = uVar1;
      return data;
    }
    if (uVar5 == 0x43) {
      if ((data & 0xfff0000) != 0x70000) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      if ((data & 0xff00) != 0) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      *(char *)((long)Lisp_world + (ulong)uVar7 + uVar2 * 2 ^ 3) = (char)data;
      return data;
    }
    if (uVar5 != 0x44) {
      if (uVar5 != 0x56) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      if ((base & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
      }
      *(LispPTR *)(Lisp_world + uVar2 + (ulong)uVar7 * 2) = data;
      return data;
    }
    if ((data & 0xfff0000) != 0x70000) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  *(short *)((ulong)(Lisp_world + uVar2 + uVar7) ^ 2) = (short)data;
  return data;
}

Assistant:

LispPTR N_OP_misc4(LispPTR data, LispPTR base, LispPTR typenumber,
                   LispPTR inx, int alpha) {
  int index, type;

  if (alpha != 7) ERROR_EXIT(inx);

  /*  test and setup index  */
  N_GetPos(inx, index, inx);

  /*  test and setup typenumber  */
  N_GetPos(typenumber, type, inx);

  aset_switch(type, inx);

doufn:
  ERROR_EXIT(inx);

}